

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmGenericFunctionPrototype
                    (ExpressionContext *ctx,VmModule *module,ExprGenericFunctionPrototype *node)

{
  VmValue *pVVar1;
  ExprVariableDefinition *local_28;
  ExprBase *expr;
  ExprGenericFunctionPrototype *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  for (local_28 = (node->contextVariables).head; local_28 != (ExprVariableDefinition *)0x0;
      local_28 = (ExprVariableDefinition *)(local_28->super_ExprBase).next) {
    CompileVm(ctx,module,&local_28->super_ExprBase);
  }
  pVVar1 = anon_unknown.dwarf_aa461::CreateVoid(module);
  return pVVar1;
}

Assistant:

VmValue* CompileVmGenericFunctionPrototype(ExpressionContext &ctx, VmModule *module, ExprGenericFunctionPrototype *node)
{
	for(ExprBase *expr = node->contextVariables.head; expr; expr = expr->next)
		CompileVm(ctx, module, expr);

	return CreateVoid(module);
}